

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int64_t gmfopenmeshf77_(char *FilNam,int *mod,int *ver,int *dim,long StrSiz)

{
  ushort **ppuVar1;
  int64_t iVar2;
  size_t sVar3;
  size_t __n;
  char TmpNam [1024];
  undefined8 uStack_430;
  char acStack_428 [1024];
  
  if (0 < StrSiz) {
    uStack_430 = 0x10ab5d;
    ppuVar1 = __ctype_b_loc();
    __n = StrSiz + 1;
    do {
      sVar3 = __n;
      __n = sVar3 - 1;
    } while ((*(byte *)((long)*ppuVar1 + (long)FilNam[sVar3 - 2] * 2 + 1) & 0x20) != 0);
    if (0 < (long)__n) {
      uStack_430 = 0x10ab86;
      memcpy(acStack_428,FilNam,__n);
    }
    acStack_428[sVar3 - 1] = '\0';
    if (*mod == 1) {
      uStack_430 = 0x10aba7;
      iVar2 = GmfOpenMesh(acStack_428,1,ver,dim);
    }
    else {
      uStack_430 = 0x10abc0;
      iVar2 = GmfOpenMesh(acStack_428,2,(ulong)(uint)*ver,(ulong)(uint)*dim);
    }
    return iVar2;
  }
  return 0;
}

Assistant:

int64_t APIF77(gmfopenmeshf77)(  char *FilNam, int *mod,
                                 int *ver, int *dim, long int StrSiz )
{
   int   i = 0;
   char  TmpNam[ GmfStrSiz ];

   if(StrSiz <= 0)
      return(0);

   // Trim trailing spaces from the fortran string
   while(isspace(FilNam[ StrSiz-1 ]))
      StrSiz--;

   for(i=0;i<StrSiz;i++)
      TmpNam[i] = FilNam[i];

   TmpNam[ StrSiz ] = 0;

   if(*mod == GmfRead)
      return(GmfOpenMesh(TmpNam, GmfRead, ver, dim));
   else
      return(GmfOpenMesh(TmpNam, GmfWrite, *ver, *dim));
}